

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O3

void __thiscall
tst_RoleMaskProxyModel::testUseRoleMaskRecurse
          (tst_RoleMaskProxyModel *this,int magicNumber,QAbstractItemModel *baseModel,
          RoleMaskProxyModel *proxyModel,QModelIndexList *magicNumerIndexes,bool userRoleEditable,
          QModelIndex *srcParent,QModelIndex *prxParent)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  undefined1 uVar4;
  uchar uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  qsizetype qVar10;
  char *pcVar11;
  char *pcVar12;
  int iVar13;
  anon_union_24_3_e3d07ef4_for_data local_c8;
  undefined8 local_b0;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  undefined8 local_90;
  ulong local_88;
  QModelIndex baseParent;
  QModelIndex proxyParent;
  
  uVar6 = (**(code **)(*(long *)baseModel + 0x78))(baseModel,srcParent);
  iVar7 = (**(code **)(*(long *)baseModel + 0x80))(baseModel,srcParent);
  if (0 < (int)uVar6) {
    local_88 = 0;
    do {
      if (0 < iVar7) {
        iVar13 = 0;
        do {
          uVar1 = local_88;
          (**(code **)(*(long *)baseModel + 0x60))
                    (&baseParent,baseModel,local_88 & 0xffffffff,iVar13,srcParent);
          (**(code **)(*(long *)proxyModel + 0x60))
                    (&proxyParent,proxyModel,uVar1 & 0xffffffff,iVar13,prxParent);
          qVar10 = QtPrivate::indexOf<QModelIndex,QModelIndex>(magicNumerIndexes,&baseParent,0);
          if (qVar10 == -1) {
            if (proxyParent.m == (QAbstractItemModel *)0x0) {
              local_c8.shared = (PrivateShared *)0x0;
              local_c8._8_8_ = 0;
              local_c8._16_8_ = 0;
              local_b0 = 2;
            }
            else {
              (**(code **)(*(long *)proxyParent.m + 0x90))
                        (&local_c8,proxyParent.m,&proxyParent,0x100);
            }
            if (baseParent.m == (QAbstractItemModel *)0x0) {
              local_a8.shared = (PrivateShared *)0x0;
              local_a8._8_8_ = 0;
              local_a8._16_8_ = 0;
              local_90 = 2;
            }
            else {
              (**(code **)(*(long *)baseParent.m + 0x90))(&local_a8,baseParent.m,&baseParent,0x100);
            }
            bVar3 = (bool)QVariant::equals((QVariant *)&local_c8);
            pcVar11 = QTest::toString<QVariant>((QVariant *)&local_c8);
            pcVar12 = QTest::toString<QVariant>((QVariant *)&local_a8);
            cVar2 = QTest::compare_helper
                              (bVar3,"Compared values are not the same",pcVar11,pcVar12,
                               "proxyParent.data(Qt::UserRole)","baseParent.data(Qt::UserRole)",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                               ,0x498);
            QVariant::~QVariant((QVariant *)&local_a8);
          }
          else {
            if (proxyParent.m == (QAbstractItemModel *)0x0) {
              local_c8.shared = (PrivateShared *)0x0;
              local_c8._8_8_ = 0;
              local_c8._16_8_ = 0;
              local_b0 = 2;
            }
            else {
              (**(code **)(*(long *)proxyParent.m + 0x90))
                        (&local_c8,proxyParent.m,&proxyParent,0x100);
            }
            iVar8 = QVariant::toInt((bool *)local_c8.data);
            cVar2 = QTest::qCompare(iVar8,magicNumber,"proxyParent.data(Qt::UserRole).toInt()",
                                    "magicNumber",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                    ,0x492);
            QVariant::~QVariant((QVariant *)&local_c8);
            if (cVar2 == '\0') {
              return;
            }
            if (userRoleEditable) {
              if (baseParent.m == (QAbstractItemModel *)0x0) {
                local_c8.shared = (PrivateShared *)0x0;
                local_c8._8_8_ = 0;
                local_c8._16_8_ = 0;
                local_b0 = 2;
              }
              else {
                (**(code **)(*(long *)baseParent.m + 0x90))
                          (&local_c8,baseParent.m,&baseParent,0x100);
              }
              iVar8 = QVariant::toInt((bool *)local_c8.data);
              cVar2 = QTest::qCompare(iVar8,~magicNumber,"baseParent.data(Qt::UserRole).toInt()",
                                      "~magicNumber",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                      ,0x494);
            }
            else {
              if (baseParent.m == (QAbstractItemModel *)0x0) {
                local_c8.shared = (PrivateShared *)0x0;
                local_c8._8_8_ = 0;
                local_c8._16_8_ = 0;
                local_b0 = 2;
              }
              else {
                (**(code **)(*(long *)baseParent.m + 0x90))
                          (&local_c8,baseParent.m,&baseParent,0x100);
              }
              iVar8 = QVariant::toInt((bool *)local_c8.data);
              cVar2 = QTest::qVerify(iVar8 != magicNumber,
                                     "baseParent.data(Qt::UserRole).toInt() != magicNumber","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                     ,0x496);
            }
          }
          QVariant::~QVariant((QVariant *)&local_c8);
          if (cVar2 == '\0') {
            return;
          }
          if (proxyParent.m == (QAbstractItemModel *)0x0) {
            local_c8.shared = (PrivateShared *)0x0;
            local_c8._8_8_ = 0;
            local_c8._16_8_ = 0;
            local_b0 = 2;
          }
          else {
            (**(code **)(*(long *)proxyParent.m + 0x90))(&local_c8,proxyParent.m,&proxyParent,0);
          }
          if (baseParent.m == (QAbstractItemModel *)0x0) {
            local_a8.shared = (PrivateShared *)0x0;
            local_a8._8_8_ = 0;
            local_a8._16_8_ = 0;
            local_90 = 2;
          }
          else {
            (**(code **)(*(long *)baseParent.m + 0x90))(&local_a8,baseParent.m,&baseParent,0);
          }
          bVar3 = (bool)QVariant::equals((QVariant *)&local_c8);
          pcVar11 = QTest::toString<QVariant>((QVariant *)&local_c8);
          pcVar12 = QTest::toString<QVariant>((QVariant *)&local_a8);
          cVar2 = QTest::compare_helper
                            (bVar3,"Compared values are not the same",pcVar11,pcVar12,
                             "proxyParent.data()","baseParent.data()",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                             ,0x49a);
          QVariant::~QVariant((QVariant *)&local_a8);
          QVariant::~QVariant((QVariant *)&local_c8);
          if (cVar2 == '\0') {
            return;
          }
          uVar4 = (**(code **)(*(long *)proxyModel + 0x88))(proxyModel,&proxyParent);
          local_c8.data[0] = uVar4;
          uVar5 = (**(code **)(*(long *)baseModel + 0x88))(baseModel,&baseParent);
          local_a8.data[0] = uVar5;
          bVar3 = local_c8.data[0] == uVar5;
          pcVar11 = QTest::toString<bool>((bool *)local_c8.data);
          pcVar12 = QTest::toString<bool>((bool *)local_a8.data);
          cVar2 = QTest::compare_helper
                            (bVar3,"Compared values are not the same",pcVar11,pcVar12,
                             "proxyModel->hasChildren(proxyParent)",
                             "baseModel->hasChildren(baseParent)",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                             ,0x49b);
          if (cVar2 == '\0') {
            return;
          }
          cVar2 = (**(code **)(*(long *)baseModel + 0x88))(baseModel,&baseParent);
          if (cVar2 != '\0') {
            testUseRoleMaskRecurse
                      (this,magicNumber,baseModel,proxyModel,magicNumerIndexes,userRoleEditable,
                       &baseParent,&proxyParent);
          }
          iVar13 = iVar13 + 1;
        } while (iVar7 != iVar13);
      }
      uVar9 = (int)local_88 + 1;
      local_88 = (ulong)uVar9;
    } while (uVar9 != uVar6);
  }
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testUseRoleMaskRecurse(const int magicNumber, const QAbstractItemModel *const baseModel,
                                                    const RoleMaskProxyModel *const proxyModel, const QModelIndexList &magicNumerIndexes,
                                                    const bool userRoleEditable, const QModelIndex &srcParent, const QModelIndex &prxParent)
{
    const int rowCnt = baseModel->rowCount(srcParent);
    const int colCnt = baseModel->columnCount(srcParent);
    for (int i = 0; i < rowCnt; ++i) {
        for (int j = 0; j < colCnt; ++j) {
            const QModelIndex baseParent = baseModel->index(i, j, srcParent);
            const QModelIndex proxyParent = proxyModel->index(i, j, prxParent);
            if (magicNumerIndexes.contains(baseParent)) {
                QCOMPARE(proxyParent.data(Qt::UserRole).toInt(), magicNumber);
                if (userRoleEditable)
                    QCOMPARE(baseParent.data(Qt::UserRole).toInt(), ~magicNumber);
                else
                    QVERIFY(baseParent.data(Qt::UserRole).toInt() != magicNumber);
            } else {
                QCOMPARE(proxyParent.data(Qt::UserRole), baseParent.data(Qt::UserRole));
            }
            QCOMPARE(proxyParent.data(), baseParent.data());
            QCOMPARE(proxyModel->hasChildren(proxyParent), baseModel->hasChildren(baseParent));
            if (baseModel->hasChildren(baseParent))
                testUseRoleMaskRecurse(magicNumber, baseModel, proxyModel, magicNumerIndexes, userRoleEditable, baseParent, proxyParent);
        }
    }
}